

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mthrowu.c
# Opt level: O0

void m_throw(monst *mon,int x,int y,int dx,int dy,int range,obj *obj)

{
  char cVar1;
  short sVar2;
  bool bVar3;
  obj *obj_00;
  int dx_00;
  byte bVar4;
  boolean bVar5;
  uchar aatyp;
  int iVar6;
  int x_00;
  int y_00;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  char *local_2a8;
  int local_29c;
  monst *local_278;
  int local_26c;
  char local_258 [4];
  int num_eyes;
  char knmbuf [256];
  char onmbuf [256];
  int local_50;
  int local_4c;
  int local_48;
  int blindinc;
  int hitu;
  char sym;
  obj *ostack;
  obj *singleobj;
  monst *mtmp;
  int local_20;
  int range_local;
  int dy_local;
  int dx_local;
  int y_local;
  int x_local;
  monst *mon_local;
  
  cVar1 = obj->oclass;
  local_4c = 0;
  bhitpos.x = (xchar)x;
  bhitpos.y = (xchar)y;
  mtmp._4_4_ = range;
  local_20 = dy;
  range_local = dx;
  dy_local = y;
  dx_local = x;
  _y_local = mon;
  if (obj->quan == 1) {
    if (mon->mw == obj) {
      setmnotwielded(mon,obj);
      _y_local->mw = (obj *)0x0;
    }
    obj_extract_self(obj);
    _hitu = (obj *)0x0;
    ostack = obj;
  }
  else {
    _hitu = obj;
    ostack = splitobj(obj,1);
    obj_extract_self(ostack);
  }
  ostack->owornmask = 0;
  if (((*(uint *)&ostack->field_0x4a & 1) == 0) ||
     (((range_local == 0 && (local_20 == 0)) || (iVar6 = rn2(7), iVar6 != 0)))) goto LAB_0025c540;
  if (_y_local->wormno == '\0') {
    if ((viz_array[_y_local->my][_y_local->mx] & 2U) != 0) goto LAB_0025c37a;
    if (((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
         && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
       (((u.uprops[0x40].intrinsic != 0 ||
         ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
        ((_y_local->data->mflags3 & 0x200) != 0)))) {
      bVar4 = viz_array[_y_local->my][_y_local->mx] & 1;
      goto joined_r0x0025c374;
    }
  }
  else {
    bVar4 = worm_known(level,_y_local);
joined_r0x0025c374:
    if (bVar4 != 0) {
LAB_0025c37a:
      if (((((((*(uint *)&_y_local->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
            (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
          (((*(uint *)&_y_local->field_0x60 >> 7 & 1) == 0 &&
           ((*(uint *)&_y_local->field_0x60 >> 9 & 1) == 0)))) &&
         ((((byte)u._1052_1_ >> 5 & 1) == 0 && (flags.verbose != '\0')))) {
        if ((((ostack->oclass == '\x02') || (ostack->oclass == '\r')) &&
            (-0x19 < objects[ostack->otyp].oc_subtyp)) && (objects[ostack->otyp].oc_subtyp < -0x15))
        {
          pcVar9 = Monnam(_y_local);
          pline("%s misfires!",pcVar9);
        }
        else {
          pcVar9 = Tobjnam(ostack,"slip");
          pcVar8 = mon_nam(_y_local);
          pline("%s as %s throws it!",pcVar9,pcVar8);
        }
      }
    }
  }
  iVar6 = rn2(3);
  range_local = iVar6 + -1;
  local_20 = rn2(3);
  local_20 = local_20 + -1;
  if ((range_local == 0) && (local_20 == 0)) {
    drop_throw(_y_local,ostack,_hitu,'\0','\0',(int)bhitpos.x,(int)bhitpos.y);
    return;
  }
LAB_0025c540:
  if (((((bhitpos.x + range_local < 1) || (0x4f < bhitpos.x + range_local)) ||
       (bhitpos.y + local_20 < 0)) ||
      ((0x14 < bhitpos.y + local_20 ||
       (level->locations[bhitpos.x + range_local][bhitpos.y + local_20].typ < '\x11')))) ||
     ((bVar5 = closed_door(level,bhitpos.x + range_local,bhitpos.y + local_20), bVar5 != '\0' ||
      ((level->locations[bhitpos.x + range_local][bhitpos.y + local_20].typ == '\x16' &&
       (bVar5 = hits_bars(&ostack,(int)bhitpos.x,(int)bhitpos.y,range_local,local_20,0,0),
       bVar5 != '\0')))))) {
    drop_throw(_y_local,ostack,_hitu,'\0','\0',(int)bhitpos.x,(int)bhitpos.y);
  }
  else {
    if (cVar1 != '\0') {
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar5 = dmgtype(youmonst.data,0x24), bVar5 != '\0')))) {
        local_26c = (int)ostack->otyp;
      }
      else {
        local_26c = display_rng(0x219);
        local_26c = local_26c + 1;
      }
      tmp_at(-4,local_26c + 1);
    }
    while (iVar6 = mtmp._4_4_ + -1, bVar3 = 0 < mtmp._4_4_, mtmp._4_4_ = iVar6, bVar3) {
      bhitpos.x = bhitpos.x + (char)range_local;
      bhitpos.y = bhitpos.y + (char)local_20;
      if ((level->monsters[bhitpos.x][bhitpos.y] == (monst *)0x0) ||
         ((*(uint *)&level->monsters[bhitpos.x][bhitpos.y]->field_0x60 >> 9 & 1) != 0)) {
        local_278 = (monst *)0x0;
      }
      else {
        local_278 = level->monsters[bhitpos.x][bhitpos.y];
      }
      singleobj = (obj *)local_278;
      if (local_278 == (monst *)0x0) {
        if ((bhitpos.x != u.ux) || (bhitpos.y != u.uy)) {
          if (((iVar6 != 0) &&
              (((0 < bhitpos.x + range_local && (bhitpos.x + range_local < 0x50)) &&
               (-1 < bhitpos.y + local_20)))) &&
             (((bhitpos.y + local_20 < 0x15 &&
               ('\x10' < level->locations[bhitpos.x + range_local][bhitpos.y + local_20].typ)) &&
              (bVar5 = closed_door(level,bhitpos.x + range_local,bhitpos.y + local_20),
              dx_00 = range_local, iVar6 = local_20, bVar5 == '\0')))) {
            if (level->locations[bhitpos.x + range_local][bhitpos.y + local_20].typ == '\x16') {
              x_00 = (int)bhitpos.x;
              y_00 = (int)bhitpos.y;
              iVar7 = rn2(5);
              bVar5 = hits_bars(&ostack,x_00,y_00,dx_00,iVar6,(uint)((iVar7 != 0 ^ 0xffU) & 1),0);
              if (bVar5 != '\0') goto LAB_0025d32f;
            }
            if (level->locations[bhitpos.x][bhitpos.y].typ != '\x1f') goto LAB_0025d36c;
          }
LAB_0025d32f:
          if (ostack != (obj *)0x0) {
            drop_throw(_y_local,ostack,_hitu,'\0','\0',(int)bhitpos.x,(int)bhitpos.y);
          }
          break;
        }
        if (multi != 0) {
          nomul(0,(char *)0x0);
        }
        if (((ostack->oclass == '\r') && (ostack->otyp < 0x20f)) &&
           (((youmonst.data)->mlet == '\x15' && (((youmonst.data)->mflags2 & 0x20000000) != 0)))) {
          if (ostack->otyp < 0x206) {
            pcVar9 = mon_nam(_y_local);
            pcVar9 = s_suffix(pcVar9);
            pline("You accept %s gift in the spirit in which it was intended.",pcVar9);
            obj_00 = ostack;
            pcVar9 = xname(ostack);
            hold_another_object(obj_00,"You catch, but drop, %s.",pcVar9,"You catch:");
          }
          else {
            pcVar9 = xname(ostack);
            pline("You catch the %s.",pcVar9);
            pcVar9 = mon_nam(_y_local);
            pcVar9 = s_suffix(pcVar9);
            pline("You are not interested in %s junk.",pcVar9);
            discover_object((int)ostack->otyp,'\x01','\x01');
            dropy(ostack);
          }
          break;
        }
        if (ostack->oclass == '\b') {
          if (((u.uprops[0x1e].intrinsic == 0) &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            *(uint *)&ostack->field_0x4a = *(uint *)&ostack->field_0x4a & 0xffffffdf | 0x20;
          }
          potionhit(&youmonst,ostack,'\0');
          break;
        }
        sVar2 = ostack->otyp;
        if (sVar2 == 0x10f) {
          if ((((long)ostack->corpsenm & 0x3ffffffffffffffU) == 0xc) ||
             (((long)ostack->corpsenm & 0x3ffffffffffffffU) == 0xb)) goto LAB_0025cb80;
          warning("monster throwing egg type %d",(ulong)(uint)ostack->corpsenm);
          local_48 = 0;
        }
        else if ((sVar2 == 0x120) || (sVar2 == 0x218)) {
LAB_0025cb80:
          local_48 = thitu(8,0,ostack,_hitu,_y_local,(char *)0x0);
        }
        else {
          local_50 = dmgval(_y_local,ostack,'\x01',&youmonst);
          iVar6 = distmin((int)u.ux,(int)u.uy,(int)_y_local->mx,(int)_y_local->my);
          onmbuf._252_4_ = 3 - iVar6;
          if ((int)onmbuf._252_4_ < -4) {
            onmbuf[0xfc] = -4;
            onmbuf[0xfd] = -1;
            onmbuf[0xfe] = -1;
            onmbuf[0xff] = -1;
          }
          if (((_y_local->data->mflags2 & 0x10) != 0) && (objects[ostack->otyp].oc_subtyp == '\x16')
             ) {
            iVar6 = onmbuf._252_4_ + 1;
            if ((_y_local->mw != (obj *)0x0) && (_y_local->mw->otyp == 0x43)) {
              iVar6 = onmbuf._252_4_ + 2;
            }
            onmbuf._252_4_ = iVar6;
            if (ostack->otyp == 2) {
              local_50 = local_50 + 1;
            }
          }
          if (2 < (youmonst.data)->msize) {
            onmbuf._252_4_ = onmbuf._252_4_ + 1;
          }
          if (local_50 < 1) {
            local_50 = 1;
          }
          local_48 = thitu(ostack->spe + 8 + onmbuf._252_4_,local_50,ostack,_hitu,_y_local,
                           (char *)0x0);
        }
        if ((((local_48 != 0) && ((*(uint *)&ostack->field_0x4a >> 0xf & 1) != 0)) &&
            (ostack->oclass == '\x02')) &&
           ((-0x1b < objects[ostack->otyp].oc_subtyp && (objects[ostack->otyp].oc_subtyp < -0x15))))
        {
          pcVar9 = xname(ostack);
          strcpy(knmbuf + 0xf8,pcVar9);
          pcVar9 = killer_xname(ostack);
          strcpy(local_258,pcVar9);
          poisoned(knmbuf + 0xf8,0,local_258,-10);
        }
        if (local_48 != 0) {
          aatyp = 0xfe;
          if (ostack->otyp == 0x218) {
            aatyp = '\n';
          }
          bVar5 = can_blnd((monst *)0x0,&youmonst,aatyp,ostack);
          if (bVar5 != '\0') {
            local_4c = rnd(0x19);
            if (ostack->otyp == 0x120) {
              if (((u.uprops[0x1e].intrinsic == 0) &&
                  (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                   (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                 ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
                bVar5 = piday();
                pcVar9 = "creamed";
                if (bVar5 != '\0') {
                  pcVar9 = "pied";
                }
                pline("Yecch!  You\'ve been %s.",pcVar9);
              }
              else {
                pcVar9 = body_part(2);
                pline("There\'s something sticky all over your %s.",pcVar9);
              }
            }
            else if (ostack->otyp == 0x218) {
              if (((youmonst.data)->mflags1 & 0x1000) == 0) {
                local_29c = 2;
                if (youmonst.data == mons + 0x17b || youmonst.data == mons + 0x1e) {
                  local_29c = 1;
                }
              }
              else {
                local_29c = 0;
              }
              if ((((u.uprops[0x1e].intrinsic == 0) &&
                   ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                  (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                 ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
                pline("The venom blinds you.");
              }
              else {
                if (local_29c == 1) {
                  local_2a8 = body_part(1);
                }
                else {
                  pcVar9 = body_part(1);
                  local_2a8 = makeplural(pcVar9);
                }
                pcVar9 = "";
                if (local_29c == 1) {
                  pcVar9 = "s";
                }
                pline("Your %s sting%s.",local_2a8,pcVar9);
              }
            }
          }
        }
        if ((((local_48 != 0) && (ostack->otyp == 0x10f)) &&
            ((u.uprops[8].extrinsic == 0 && ((youmonst.mintrinsics & 0x80) == 0)))) &&
           ((bVar5 = poly_when_stoned(youmonst.data), bVar5 == '\0' ||
            (iVar6 = polymon(0x108), iVar6 == 0)))) {
          u.uprops[0x21].intrinsic = 5;
          killer = (char *)0x0;
        }
        stop_occupation();
        if ((local_48 != 0) || (mtmp._4_4_ == 0)) {
          drop_throw(_y_local,ostack,_hitu,(boolean)local_48,(boolean)local_48,(int)u.ux,(int)u.uy);
          break;
        }
      }
      else {
        iVar6 = ohitmon(_y_local,local_278,ostack,_hitu,iVar6,'\x01');
        if (iVar6 != 0) break;
      }
LAB_0025d36c:
      tmp_at((int)bhitpos.x,(int)bhitpos.y);
      (*windowprocs.win_delay)();
    }
    tmp_at((int)bhitpos.x,(int)bhitpos.y);
    (*windowprocs.win_delay)();
    tmp_at(-6,0);
    if (local_4c != 0) {
      u.ucreamed = local_4c + u.ucreamed;
      make_blinded((ulong)u.uprops[0x1e].intrinsic + (long)local_4c,'\0');
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        pline("Your vision quickly clears.");
      }
      else if (flags.verbose != '\0') {
        pcVar9 = body_part(2);
        pline("Use the command #wipe to clean your %s.",pcVar9);
      }
    }
  }
  return;
}

Assistant:

void m_throw(struct monst *mon, int x, int y, int dx, int dy,
	     int range, struct obj *obj)
{
	struct monst *mtmp;
	struct obj *singleobj, *ostack;
	char sym = obj->oclass;
	int hitu, blindinc = 0;

	bhitpos.x = x;
	bhitpos.y = y;

	if (obj->quan == 1L) {
	    /*
	     * Remove object from minvent.  This cannot be done later on;
	     * what if the player dies before then, leaving the monster
	     * with 0 daggers?  (This caused the infamous 2^32-1 orcish
	     * dagger bug).
	     *
	     * VENOM is not in minvent - it should already be OBJ_FREE.
	     * The extract below does nothing.
	     */

	    /* not possibly_unwield, which checks the object's */
	    /* location, not its existence */
	    if (MON_WEP(mon) == obj) {
		    setmnotwielded(mon,obj);
		    MON_NOWEP(mon);
	    }
	    obj_extract_self(obj);
	    ostack = NULL;
	    singleobj = obj;
	    obj = NULL;
	} else {
	    ostack = obj;
	    singleobj = splitobj(obj, 1L);
	    obj_extract_self(singleobj);
	}

	singleobj->owornmask = 0; /* threw one of multiple weapons in hand? */

	if (singleobj->cursed && (dx || dy) && !rn2(7)) {
	    if (canseemon(level, mon) && flags.verbose) {
		if (is_ammo(singleobj))
		    pline("%s misfires!", Monnam(mon));
		else
		    pline("%s as %s throws it!",
			  Tobjnam(singleobj, "slip"), mon_nam(mon));
	    }
	    dx = rn2(3)-1;
	    dy = rn2(3)-1;
	    /* check validity of new direction */
	    if (!dx && !dy) {
		drop_throw(mon, singleobj, ostack, FALSE, FALSE,
			   bhitpos.x, bhitpos.y);
		return;
	    }
	}

	/* pre-check for doors, walls and boundaries.
	   Also need to pre-check for bars regardless of direction;
	   the random chance for small objects hitting bars is
	   skipped when reaching them at point blank range */
	if (!isok(bhitpos.x+dx,bhitpos.y+dy)
	    || IS_ROCK(level->locations[bhitpos.x+dx][bhitpos.y+dy].typ)
	    || closed_door(level, bhitpos.x+dx, bhitpos.y+dy)
	    || (level->locations[bhitpos.x + dx][bhitpos.y + dy].typ == IRONBARS &&
		hits_bars(&singleobj, bhitpos.x, bhitpos.y, dx, dy, 0, 0))) {
	    drop_throw(mon, singleobj, ostack, FALSE, FALSE,
		       bhitpos.x, bhitpos.y);
	    return;
	}

	/* Note: drop_throw may destroy singleobj.  Since obj must be destroyed
	 * early to avoid the dagger bug, anyone who modifies this code should
	 * be careful not to use either one after it's been freed.
	 */
	if (sym)
	    tmp_at(DISP_OBJECT, dbuf_objid(singleobj));
	
	while (range-- > 0) { /* Actually the loop is always exited by break */
		bhitpos.x += dx;
		bhitpos.y += dy;
		if ((mtmp = m_at(level, bhitpos.x, bhitpos.y)) != 0) {
		    if (ohitmon(mon, mtmp, singleobj, ostack, range, TRUE))
			break;
		} else if (bhitpos.x == u.ux && bhitpos.y == u.uy) {
		    if (multi) nomul(0, NULL);

		    if (singleobj->oclass == GEM_CLASS &&
			    singleobj->otyp <= LAST_GEM+9 /* 9 glass colors */
			    && is_unicorn(youmonst.data)) {
			if (singleobj->otyp > LAST_GEM) {
			    pline("You catch the %s.", xname(singleobj));
			    pline("You are not interested in %s junk.",
				s_suffix(mon_nam(mon)));
			    makeknown(singleobj->otyp);
			    dropy(singleobj);
			} else {
			    pline("You accept %s gift in the spirit in which it was intended.",
				s_suffix(mon_nam(mon)));
			    hold_another_object(singleobj,
				"You catch, but drop, %s.", xname(singleobj),
				"You catch:");
			}
			break;
		    }
		    if (singleobj->oclass == POTION_CLASS) {
			if (!Blind) singleobj->dknown = 1;
			potionhit(&youmonst, singleobj, FALSE);
			break;
		    }
		    switch(singleobj->otyp) {
			int dam, hitv;
			case EGG:
			    if (!touch_petrifies(&mons[singleobj->corpsenm])) {
				warning("monster throwing egg type %d",
					singleobj->corpsenm);
				hitu = 0;
				break;
			    }
			    /* fall through */
			case CREAM_PIE:
			case BLINDING_VENOM:
			    hitu = thitu(8, 0, singleobj, ostack, mon, NULL);
			    break;
			default:
			    dam = dmgval(mon, singleobj, TRUE, &youmonst);
			    hitv = 3 - distmin(u.ux,u.uy, mon->mx,mon->my);
			    if (hitv < -4) hitv = -4;
			    if (is_elf(mon->data) &&
				objects[singleobj->otyp].oc_skill == P_BOW) {
				hitv++;
				if (MON_WEP(mon) &&
				    MON_WEP(mon)->otyp == ELVEN_BOW)
				    hitv++;
				if (singleobj->otyp == ELVEN_ARROW) dam++;
			    }
			    if (bigmonst(youmonst.data)) hitv++;
			    hitv += 8 + singleobj->spe;
			    if (dam < 1) dam = 1;
			    hitu = thitu(hitv, dam, singleobj, ostack, mon, NULL);
		    }
		    if (hitu && singleobj->opoisoned &&
			is_poisonable(singleobj)) {
			char onmbuf[BUFSZ], knmbuf[BUFSZ];

			strcpy(onmbuf, xname(singleobj));
			strcpy(knmbuf, killer_xname(singleobj));
			poisoned(onmbuf, A_STR, knmbuf, -10);
		    }
		    if (hitu &&
		       can_blnd(NULL, &youmonst,
				(uchar)(singleobj->otyp == BLINDING_VENOM ?
					AT_SPIT : AT_WEAP), singleobj)) {
			blindinc = rnd(25);
			if (singleobj->otyp == CREAM_PIE) {
			    if (!Blind) pline("Yecch!  You've been %s.",
					      piday() ? "pied" : "creamed");
			    else pline("There's something sticky all over your %s.",
				       body_part(FACE));
			} else if (singleobj->otyp == BLINDING_VENOM) {
			    int num_eyes = eyecount(youmonst.data);
			    /* venom in the eyes */
			    if (!Blind) pline("The venom blinds you.");
			    else pline("Your %s sting%s.",
				      (num_eyes == 1) ? body_part(EYE) :
						makeplural(body_part(EYE)),
				      (num_eyes == 1) ? "s" : "");
			}
		    }
		    if (hitu && singleobj->otyp == EGG) {
			if (!Stone_resistance
			    && !(poly_when_stoned(youmonst.data) &&
				 polymon(PM_STONE_GOLEM))) {
			    Stoned = 5;
			    killer = NULL;
			}
		    }
		    stop_occupation();
		    if (hitu || !range) {
			drop_throw(mon, singleobj, ostack, hitu, hitu,
				   u.ux, u.uy);
			break;
		    }
		} else if (!range	/* reached end of path */
			/* missile hits edge of screen */
			|| !isok(bhitpos.x+dx,bhitpos.y+dy)
			/* missile hits the wall */
			|| IS_ROCK(level->locations[bhitpos.x+dx][bhitpos.y+dy].typ)
			/* missile hit closed door */
			|| closed_door(level, bhitpos.x+dx, bhitpos.y+dy)
			/* missile might hit iron bars */
			|| (level->locations[bhitpos.x+dx][bhitpos.y+dy].typ == IRONBARS &&
			hits_bars(&singleobj, bhitpos.x, bhitpos.y, dx, dy, !rn2(5), 0))
			/* Thrown objects "sink" */
			|| IS_SINK(level->locations[bhitpos.x][bhitpos.y].typ)) {
		    if (singleobj) { /* hits_bars might have destroyed it */
			drop_throw(mon, singleobj, ostack, FALSE, FALSE,
				   bhitpos.x, bhitpos.y);
		    }
		    break;
		}
		tmp_at(bhitpos.x, bhitpos.y);
		win_delay_output();
	}
	tmp_at(bhitpos.x, bhitpos.y);
	win_delay_output();
	tmp_at(DISP_END, 0);

	if (blindinc) {
		u.ucreamed += blindinc;
		make_blinded(Blinded + (long)blindinc, FALSE);
		if (!Blind)
		    pline("Your vision quickly clears.");
		else if (flags.verbose)
		    pline("Use the command #wipe to clean your %s.", body_part(FACE));
	}
}